

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_6027d3::ReferenceType::printLeft(ReferenceType *this,OutputStream *s)

{
  int iVar1;
  undefined4 extraout_var;
  ReferenceKind RVar3;
  char *__src;
  size_t Size;
  Node *pNVar4;
  size_t N;
  char cVar5;
  long lVar2;
  
  if (this->Printing != false) {
    return;
  }
  this->Printing = true;
  RVar3 = this->RK;
  pNVar4 = this->Pointee;
  do {
    iVar1 = (*pNVar4->_vptr_Node[3])(pNVar4,s);
    lVar2 = CONCAT44(extraout_var,iVar1);
    if (*(char *)(lVar2 + 8) == '\f') {
      pNVar4 = *(Node **)(lVar2 + 0x10);
      if ((int)*(ReferenceKind *)(lVar2 + 0x18) < (int)RVar3) {
        RVar3 = *(ReferenceKind *)(lVar2 + 0x18);
      }
    }
  } while (*(char *)(lVar2 + 8) == '\f');
  (*pNVar4->_vptr_Node[4])(pNVar4,s);
  if (pNVar4->ArrayCache == Unknown) {
    iVar1 = (*pNVar4->_vptr_Node[1])(pNVar4,s);
    cVar5 = (char)iVar1;
  }
  else {
    cVar5 = pNVar4->ArrayCache == Yes;
  }
  if (cVar5 != '\0') {
    OutputStream::grow(s,1);
    s->Buffer[s->CurrentPosition] = ' ';
    s->CurrentPosition = s->CurrentPosition + 1;
  }
  if (pNVar4->ArrayCache == Unknown) {
    iVar1 = (*pNVar4->_vptr_Node[1])(pNVar4,s);
    cVar5 = (char)iVar1;
  }
  else {
    cVar5 = pNVar4->ArrayCache == Yes;
  }
  if (cVar5 == '\0') {
    if (pNVar4->FunctionCache == Unknown) {
      iVar1 = (*pNVar4->_vptr_Node[2])(pNVar4,s);
      cVar5 = (char)iVar1;
    }
    else {
      cVar5 = pNVar4->FunctionCache == Yes;
    }
    if (cVar5 == '\0') goto LAB_001f4aa3;
  }
  OutputStream::grow(s,1);
  s->Buffer[s->CurrentPosition] = '(';
  s->CurrentPosition = s->CurrentPosition + 1;
LAB_001f4aa3:
  __src = "&&";
  if (RVar3 == LValue) {
    __src = "&";
  }
  N = (ulong)(RVar3 != LValue) + 1;
  OutputStream::grow(s,N);
  memcpy(s->Buffer + s->CurrentPosition,__src,N);
  s->CurrentPosition = s->CurrentPosition + N;
  this->Printing = false;
  return;
}

Assistant:

void printLeft(OutputStream &s) const override {
    if (Printing)
      return;
    SwapAndRestore<bool> SavePrinting(Printing, true);
    std::pair<ReferenceKind, const Node *> Collapsed = collapse(s);
    Collapsed.second->printLeft(s);
    if (Collapsed.second->hasArray(s))
      s += " ";
    if (Collapsed.second->hasArray(s) || Collapsed.second->hasFunction(s))
      s += "(";

    s += (Collapsed.first == ReferenceKind::LValue ? "&" : "&&");
  }